

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalizer.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Normalizer::ByteSizeLong(Normalizer *this)

{
  Normalizer_NormType NVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Normalizer *this_local;
  
  sStack_18 = 0;
  NVar1 = normtype(this);
  if (NVar1 != Normalizer_NormType_LMax) {
    NVar1 = normtype(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(NVar1);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t Normalizer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Normalizer)
  size_t total_size = 0;

  // .CoreML.Specification.Normalizer.NormType normType = 1;
  if (this->normtype() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->normtype());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}